

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactive.cpp
# Opt level: O0

int printS(Sudoku *s,int u,int v)

{
  code *pcVar1;
  ostream *poVar2;
  int local_24;
  int local_20;
  int i;
  int x;
  int y;
  int v_local;
  int u_local;
  Sudoku *s_local;
  
  for (i = 0; i < 9; i = i + 1) {
    if ((i == 3) || (i == 6)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"---------+--------+---------");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"+--+--+--|--+--+--|--+--+--+");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
      if (((uint)(s->s).pole[i * 9 + local_20] & 0xf) == 0) {
        if ((u == local_20) && (v == i)) {
          std::operator<<((ostream *)&std::cout,"|O<");
        }
        else {
          std::operator<<((ostream *)&std::cout,"|. ");
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"|");
        std::ostream::operator<<
                  ((ostream *)&std::cout,(uint)(*(byte *)((s->s).pole + (i * 9 + local_20)) & 0xf));
        if ((*(byte *)((s->s).pole + (i * 9 + local_20)) >> 4 & 1) == 0) {
          std::operator<<((ostream *)&std::cout," ");
        }
        else if ((u == local_20) && (v == i)) {
          std::operator<<((ostream *)&std::cout,"X");
        }
        else {
          std::operator<<((ostream *)&std::cout,".");
        }
      }
    }
    std::operator<<((ostream *)&std::cout,"|");
    if (v == i) {
      std::operator<<((ostream *)&std::cout,"<--");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"+--+--+--|--+--+--|--+--+--+");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout," ");
  for (local_24 = 0; SBORROW4(local_24,u * 3) != local_24 + u * -3 < 0; local_24 = local_24 + 3) {
    std::operator<<((ostream *)&std::cout,"   ");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"^");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int printS ( Sudoku * s, int u, int v )
{
  for(int y=0;y<9;y++) // projdeme radky
  {
    // formatovani car podle toho, ktery radek se zpracovava
    if(y == 3 || y == 6)
    {
      cout << "---------+--------+---------" << endl;
    }
    else
    {
      cout << "+--+--+--|--+--+--|--+--+--+" << endl;
    }
    for(int x=0;x<9;x++)// projdeme bunky v radku
    {
      if (s->s.pole[y*9+x].zapsane) // je tam neco?
      {
        cout << "|";
        cout<< s->s.pole[y*9+x].zapsane; // vypiseme
        if(s->s.pole[y*9+x].pevne) // pridame za to x, pkud je to pevna hodnota
        {
          if(u == x && v == y)
            cout << "X";
          else cout << ".";
        }
        else cout << " ";
      }
      else
      {
        if(u == x && v == y)
          cout<< "|O<";
        else
          cout<< "|. ";
      }
    } 
    cout << "|";
    if(v == y) cout << "<--"; // kresleni ukazatele polohy
    cout << endl;
  }
  cout << "+--+--+--|--+--+--|--+--+--+" << endl;
  cout << " ";
  // kresleni ukazatele polohy
  for (int i = 0;i< u*3; i+=3)
  {
    cout << "   ";
  }
  cout << "^" << endl;
}